

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-reconstruct.cc
# Opt level: O1

optional<tinyusdz::Animatable<float>_> *
tinyusdz::prim::anon_unknown_0::ConvertToAnimatable<float>
          (optional<tinyusdz::Animatable<float>_> *__return_storage_ptr__,PrimVar *var)

{
  undefined1 uVar1;
  vtable_type *pvVar2;
  pointer pSVar3;
  bool bVar4;
  char cVar5;
  uint32_t uVar6;
  TimeSamples *this;
  long lVar7;
  ulong uVar8;
  optional<float> pv;
  Animatable<float> dst;
  optional<float> local_80;
  storage_t<float> local_78;
  undefined2 local_74;
  TypedTimeSamples<float> local_70;
  optional<tinyusdz::Animatable<float>_> *local_50;
  optional<float> local_48;
  storage_t<tinyusdz::Animatable<float>_> *local_40;
  TimeSamples *local_38;
  
  local_78 = (storage_t<float>)0x0;
  local_74 = 0;
  local_70._samples.
  super__Vector_base<tinyusdz::TypedTimeSamples<float>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<float>::Sample>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_70._samples.
  super__Vector_base<tinyusdz::TypedTimeSamples<float>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<float>::Sample>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
  local_70._samples.
  super__Vector_base<tinyusdz::TypedTimeSamples<float>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<float>::Sample>_>
  ._M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
  local_70._samples.
  super__Vector_base<tinyusdz::TypedTimeSamples<float>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<float>::Sample>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
  local_70._samples.
  super__Vector_base<tinyusdz::TypedTimeSamples<float>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<float>::Sample>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._1_7_ = 0;
  local_70._dirty = false;
  bVar4 = primvar::PrimVar::is_valid(var);
  if (bVar4) {
    if ((var->_blocked == false) &&
       (((pvVar2 = (var->_value).v_.vtable, pvVar2 != (vtable_type *)0x0 &&
         (uVar6 = (*pvVar2->type_id)(), uVar6 == 0)) ||
        ((pvVar2 = (var->_value).v_.vtable, pvVar2 != (vtable_type *)0x0 &&
         (uVar6 = (*pvVar2->type_id)(), uVar6 == 1)))))) {
      cVar5 = '\0';
    }
    else {
      primvar::PrimVar::get_value<float>(&local_80,var);
      cVar5 = local_80.has_value_;
      if (local_80.has_value_ == true) {
        local_78 = local_80.contained;
        local_74 = 1;
      }
    }
    if ((var->_ts)._samples.
        super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
        ._M_impl.super__Vector_impl_data._M_finish ==
        (var->_ts)._samples.
        super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      if (cVar5 == '\0') goto LAB_002574c1;
    }
    else {
      uVar1 = __return_storage_ptr__->has_value_;
      local_50 = __return_storage_ptr__;
      if ((var->_ts)._samples.
          super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
          ._M_impl.super__Vector_impl_data._M_finish !=
          (var->_ts)._samples.
          super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        this = &var->_ts;
        local_40 = &__return_storage_ptr__->contained;
        lVar7 = 0;
        uVar8 = 0;
        local_38 = this;
        do {
          if ((var->_ts)._dirty == true) {
            tinyusdz::value::TimeSamples::update(this);
          }
          pSVar3 = (this->_samples).
                   super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          if ((&pSVar3->blocked)[lVar7] == true) {
            TypedTimeSamples<float>::add_blocked_sample
                      (&local_70,*(double *)((long)&pSVar3->t + lVar7));
          }
          else {
            tinyusdz::value::Value::get_value<float>
                      (&local_48,(Value *)((long)&(pSVar3->value).v_.storage + lVar7),false);
            bVar4 = local_48.has_value_;
            local_80.has_value_ = local_48.has_value_;
            if (local_48.has_value_ == true) {
              local_80.contained = local_48.contained;
              TypedTimeSamples<float>::add_sample
                        (&local_70,*(double *)((long)&pSVar3->t + lVar7),
                         (float *)&local_80.contained);
            }
            else {
              *(undefined8 *)((long)local_40 + 0x10) = 0;
              *(undefined8 *)((long)local_40 + 0x18) = 0;
              *(undefined8 *)local_40 = 0;
              *(undefined8 *)((long)local_40 + 8) = 0;
              *(undefined8 *)((long)local_40 + 0x20) = 0;
              uVar1 = false;
            }
            this = local_38;
            if (bVar4 == false) {
              local_50->has_value_ = (bool)uVar1;
              __return_storage_ptr__ = local_50;
              goto LAB_002574d7;
            }
          }
          uVar8 = uVar8 + 1;
          lVar7 = lVar7 + 0x28;
        } while (uVar8 < (ulong)(((long)(var->_ts)._samples.
                                        super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)(var->_ts)._samples.
                                        super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                                        ._M_impl.super__Vector_impl_data._M_start >> 3) *
                                -0x3333333333333333));
      }
      local_50->has_value_ = (bool)uVar1;
      __return_storage_ptr__ = local_50;
    }
    __return_storage_ptr__->has_value_ = true;
    *(storage_t<float> *)&__return_storage_ptr__->contained = local_78;
    *(undefined2 *)((long)&__return_storage_ptr__->contained + 4) = local_74;
    *(pointer *)((long)&__return_storage_ptr__->contained + 8) =
         local_70._samples.
         super__Vector_base<tinyusdz::TypedTimeSamples<float>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<float>::Sample>_>
         ._M_impl.super__Vector_impl_data._M_start;
    *(ulong *)((long)&__return_storage_ptr__->contained + 0x10) =
         CONCAT71(local_70._samples.
                  super__Vector_base<tinyusdz::TypedTimeSamples<float>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<float>::Sample>_>
                  ._M_impl.super__Vector_impl_data._M_finish._1_7_,
                  local_70._samples.
                  super__Vector_base<tinyusdz::TypedTimeSamples<float>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<float>::Sample>_>
                  ._M_impl.super__Vector_impl_data._M_finish._0_1_);
    *(ulong *)((long)&__return_storage_ptr__->contained + 0x18) =
         CONCAT71(local_70._samples.
                  super__Vector_base<tinyusdz::TypedTimeSamples<float>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<float>::Sample>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage._1_7_,
                  local_70._samples.
                  super__Vector_base<tinyusdz::TypedTimeSamples<float>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<float>::Sample>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_);
    local_70._samples.
    super__Vector_base<tinyusdz::TypedTimeSamples<float>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<float>::Sample>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_70._samples.
    super__Vector_base<tinyusdz::TypedTimeSamples<float>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<float>::Sample>_>
    ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
    local_70._samples.
    super__Vector_base<tinyusdz::TypedTimeSamples<float>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<float>::Sample>_>
    ._M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
    local_70._samples.
    super__Vector_base<tinyusdz::TypedTimeSamples<float>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<float>::Sample>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
    local_70._samples.
    super__Vector_base<tinyusdz::TypedTimeSamples<float>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<float>::Sample>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._1_7_ = 0;
    *(bool *)((long)&__return_storage_ptr__->contained + 0x20) = local_70._dirty;
  }
  else {
LAB_002574c1:
    __return_storage_ptr__->has_value_ = false;
    *(undefined8 *)&__return_storage_ptr__->contained = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->contained + 8) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->contained + 0x10) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->contained + 0x18) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->contained + 0x20) = 0;
  }
LAB_002574d7:
  if (local_70._samples.
      super__Vector_base<tinyusdz::TypedTimeSamples<float>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<float>::Sample>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_70._samples.
                    super__Vector_base<tinyusdz::TypedTimeSamples<float>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<float>::Sample>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    CONCAT71(local_70._samples.
                             super__Vector_base<tinyusdz::TypedTimeSamples<float>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<float>::Sample>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage._1_7_,
                             local_70._samples.
                             super__Vector_base<tinyusdz::TypedTimeSamples<float>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<float>::Sample>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_) -
                    (long)local_70._samples.
                          super__Vector_base<tinyusdz::TypedTimeSamples<float>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<float>::Sample>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

static nonstd::optional<Animatable<T>> ConvertToAnimatable(const primvar::PrimVar &var)
{
  Animatable<T> dst;

  if (!var.is_valid()) {
    DCOUT("is_valid failed");
    DCOUT("has_value " << var.has_value());
    DCOUT("has_timesamples " << var.has_timesamples());
    return nonstd::nullopt;
  }

  bool ok = false;

  if (var.has_value()) {

    if (auto pv = var.get_value<T>()) {
      dst.set_default(pv.value());

      ok = true;
      //return std::move(dst);
    }
  }

  if (var.has_timesamples()) {
    for (size_t i = 0; i < var.ts_raw().size(); i++) {
      const value::TimeSamples::Sample &s = var.ts_raw().get_samples()[i];

      // Attribute Block?
      if (s.blocked) {
        dst.add_blocked_sample(s.t);
      } else if (auto pv = s.value.get_value<T>()) {
        dst.add_sample(s.t, pv.value());
      } else {
        // Type mismatch
        DCOUT(i << "/" << var.ts_raw().size() << " type mismatch.");
        return nonstd::nullopt;
      }
    }

    ok = true;
  }

  if (ok) {
    return std::move(dst);
  }

  DCOUT("???");
  return nonstd::nullopt;
}